

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherBase::VerifyCompute(GatherBase *this)

{
  bool bVar1;
  Vector<float,_4> *this_00;
  long lVar2;
  Vector<float,_4> local_28;
  
  lVar2 = 0;
  this_00 = (Vector<float,_4> *)
            glu::CallLogWrapper::glMapBufferRange
                      (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                       0x90d2,0,0x10,1);
  local_28.m_data[0] = 0.0;
  local_28.m_data[1] = 1.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 1.0;
  bVar1 = tcu::Vector<float,_4>::operator!=(this_00,&local_28);
  if (bVar1) {
    anon_unknown_0::Output
              ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f",SUB84((double)this_00->m_data[0],0),
               (double)this_00->m_data[1],(double)this_00->m_data[2],(double)this_00->m_data[3]);
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

virtual long VerifyCompute()
	{
		Vec4* data;
		data = static_cast<Vec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(Vec4), GL_MAP_READ_BIT));
		if (data[0] != Vec4(0, 1, 0, 1))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f", data[0].x(), data[0].y(), data[0].z(),
				   data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}